

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CursorImpl.cpp
# Opt level: O2

bool __thiscall
sf::priv::CursorImpl::loadFromPixels(CursorImpl *this,Uint8 *pixels,Vector2u size,Vector2u hotspot)

{
  byte *pbVar1;
  Display *pDVar2;
  ulong uVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  Cursor CVar6;
  byte bVar7;
  long lVar8;
  ulong uVar9;
  size_t i;
  ulong uVar10;
  ulong uVar11;
  ulong uVar12;
  Uint8 *pUVar13;
  vector<unsigned_char,_std::allocator<unsigned_char>_> data;
  vector<unsigned_char,_std::allocator<unsigned_char>_> mask;
  XColor fg;
  XColor bg;
  _Vector_base<unsigned_char,_std::allocator<unsigned_char>_> local_80;
  _Vector_base<unsigned_char,_std::allocator<unsigned_char>_> local_68;
  allocator_type local_50 [8];
  undefined4 local_48;
  undefined2 local_44;
  allocator_type local_40 [8];
  undefined4 local_38;
  undefined2 local_34;
  
  uVar12 = (ulong)size >> 0x20;
  release(this);
  uVar3 = (ulong)((size.x + 7 >> 3) * size.y);
  local_80._M_impl.super__Vector_impl_data._M_start._0_1_ = 0;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_68,uVar3,
             (value_type_conflict3 *)&local_80,local_50);
  local_50[0] = (allocator_type)0x1;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_80,uVar3,
             (value_type_conflict3 *)local_50,local_40);
  uVar3 = (ulong)size & 0xffffffff;
  pUVar13 = pixels + 3;
  lVar8 = 0;
  for (uVar9 = 0; uVar9 != uVar12; uVar9 = uVar9 + 1) {
    for (uVar10 = 0; uVar3 != uVar10; uVar10 = uVar10 + 1) {
      uVar11 = lVar8 + uVar10 >> 3;
      bVar7 = (byte)uVar10 & 7;
      local_68._M_impl.super__Vector_impl_data._M_start[uVar11] =
           local_68._M_impl.super__Vector_impl_data._M_start[uVar11] |
           (pUVar13[uVar10 * 4] != '\0') << bVar7;
      pbVar1 = (byte *)(CONCAT71(local_80._M_impl.super__Vector_impl_data._M_start._1_7_,
                                 local_80._M_impl.super__Vector_impl_data._M_start._0_1_) + uVar11);
      *pbVar1 = *pbVar1 | (0x40 < (uint)pUVar13[uVar10 * 4 + -1] +
                                  (uint)pUVar13[uVar10 * 4 + -2] + (uint)pUVar13[uVar10 * 4 + -3])
                          << bVar7;
    }
    pUVar13 = pUVar13 + uVar3 * 4;
    lVar8 = lVar8 + uVar3;
  }
  pDVar2 = this->m_display;
  uVar4 = XDefaultRootWindow(pDVar2);
  uVar4 = XCreateBitmapFromData
                    (pDVar2,uVar4,local_68._M_impl.super__Vector_impl_data._M_start,
                     (ulong)size & 0xffffffff,uVar12);
  pDVar2 = this->m_display;
  uVar5 = XDefaultRootWindow(pDVar2);
  uVar5 = XCreateBitmapFromData
                    (pDVar2,uVar5,
                     CONCAT71(local_80._M_impl.super__Vector_impl_data._M_start._1_7_,
                              local_80._M_impl.super__Vector_impl_data._M_start._0_1_),
                     (ulong)size & 0xffffffff,uVar12);
  local_44 = 0xffff;
  local_48 = 0xffffffff;
  local_34 = 0;
  local_38 = 0;
  CVar6 = XCreatePixmapCursor(this->m_display,uVar5,uVar4,local_50,local_40,hotspot,hotspot.y);
  this->m_cursor = CVar6;
  XFreePixmap(this->m_display,uVar5);
  XFreePixmap(this->m_display,uVar4);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base(&local_80);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base(&local_68);
  return true;
}

Assistant:

bool CursorImpl::loadFromPixels(const Uint8* pixels, Vector2u size, Vector2u hotspot)
{
    release();

    // Convert the image into a bitmap (monochrome!).
    std::size_t bytes = (size.x + 7) / 8 * size.y;
    std::vector<Uint8> mask(bytes, 0); // Defines which pixel is transparent.
    std::vector<Uint8> data(bytes, 1); // Defines which pixel is white/black.

    for (std::size_t j = 0; j < size.y; ++j)
    {
        for (std::size_t i = 0; i < size.x; ++i)
        {
            std::size_t pixelIndex = i + j * size.x;
            std::size_t byteIndex  = pixelIndex / 8;
            std::size_t bitIndex   = i % 8;

            // Turn on pixel that are not transparent
            Uint8 opacity = pixels[pixelIndex * 4 + 3] > 0 ? 1 : 0;
            mask[byteIndex] |= opacity << bitIndex;

            // Choose between black/background & white/foreground color for each pixel,
            // based on the pixel color intensity: on average, if a channel is "active"
            // at 25%, the bit is white.
            int intensity = pixels[pixelIndex * 4 + 0] + pixels[pixelIndex * 4 + 1] + pixels[pixelIndex * 4 + 2];
            Uint8 bit = intensity > 64 ? 1 : 0;
            data[byteIndex] |= bit << bitIndex;
        }
    }

    Pixmap maskPixmap = XCreateBitmapFromData(m_display, XDefaultRootWindow(m_display),
                                              (char*)&mask[0], size.x, size.y);
    Pixmap dataPixmap = XCreateBitmapFromData(m_display, XDefaultRootWindow(m_display),
                                              (char*)&data[0], size.x, size.y);

    // Define the foreground color as white and the background as black.
    XColor fg, bg;
    fg.red = fg.blue = fg.green = -1;
    bg.red = bg.blue = bg.green =  0;

    // Create the monochrome cursor.
    m_cursor = XCreatePixmapCursor(m_display,
                                   dataPixmap, maskPixmap,
                                   &fg, &bg,
                                   hotspot.x, hotspot.y);

    // Free the resources
    XFreePixmap(m_display, dataPixmap);
    XFreePixmap(m_display, maskPixmap);

    // We assume everything went fine...
    return true;
}